

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O0

vector<case_t,_std::allocator<case_t>_> * readTrainingData(void)

{
  __uint32_t _Var1;
  uchar *puVar2;
  uchar *puVar3;
  vector<case_t,_std::allocator<case_t>_> *in_RDI;
  int b;
  int y;
  int x;
  uint8_t *label;
  uint8_t *img;
  case_t c;
  int i;
  uint32_t case_count;
  vector<unsigned_char,_std::allocator<unsigned_char>_> train_labels;
  string *in_stack_00000108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> train_image;
  vector<case_t,_std::allocator<case_t>_> *cases;
  int in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  case_t *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  vector<case_t,_std::allocator<case_t>_> *in_stack_fffffffffffffeb0;
  allocator *paVar4;
  int in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  uint in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  uint local_a4;
  allocator local_99;
  string local_98 [79];
  allocator local_49;
  string local_48 [63];
  byte local_9;
  
  local_9 = 0;
  (in_RDI->super__Vector_base<case_t,_std::allocator<case_t>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<case_t,_std::allocator<case_t>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<case_t,_std::allocator<case_t>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<case_t,_std::allocator<case_t>_>::vector
            ((vector<case_t,_std::allocator<case_t>_> *)0x109cf9);
  paVar4 = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"../train-images.idx3-ubyte",paVar4);
  readFile(in_stack_00000108);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"../train-labels.idx1-ubyte",&local_99);
  readFile(in_stack_00000108);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x109dc2);
  _Var1 = __bswap_32(*(__uint32_t *)(puVar2 + 4));
  for (local_a4 = 0; local_a4 < _Var1; local_a4 = local_a4 + 1) {
    tensor_t<float>::tensor_t
              ((tensor_t<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,(int)((ulong)paVar4 >> 0x20));
    tensor_t<float>::tensor_t
              ((tensor_t<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,(int)((ulong)paVar4 >> 0x20));
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x109e3f);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x109e67);
    for (in_stack_fffffffffffffef4 = 0; in_stack_fffffffffffffef4 < 0x1c;
        in_stack_fffffffffffffef4 = in_stack_fffffffffffffef4 + 1) {
      for (in_stack_fffffffffffffef0 = 0; in_stack_fffffffffffffef0 < 0x1c;
          in_stack_fffffffffffffef0 = in_stack_fffffffffffffef0 + 1) {
        in_stack_fffffffffffffeac =
             (float)puVar2[(long)(int)in_stack_fffffffffffffef4 +
                           (long)(int)in_stack_fffffffffffffef0 * 0x1c +
                           (long)(int)local_a4 * 0x310 + 0x10] * 0.003921569;
        in_stack_fffffffffffffeb0 =
             (vector<case_t,_std::allocator<case_t>_> *)
             tensor_t<float>::operator()
                       (&in_stack_fffffffffffffea0->data,(int)in_stack_fffffffffffffe9c,
                        in_stack_fffffffffffffe98,0);
        *(float *)&(in_stack_fffffffffffffeb0->super__Vector_base<case_t,_std::allocator<case_t>_>).
                   _M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffeac;
      }
    }
    for (in_stack_fffffffffffffeec = 0; in_stack_fffffffffffffeec < 10;
        in_stack_fffffffffffffeec = in_stack_fffffffffffffeec + 1) {
      in_stack_fffffffffffffe9c =
           (float)((uint)(puVar3[(long)(int)local_a4 + 8] == in_stack_fffffffffffffeec) * 0x3f800000
                  );
      in_stack_fffffffffffffea0 =
           (case_t *)
           tensor_t<float>::operator()
                     (&in_stack_fffffffffffffea0->data,(int)in_stack_fffffffffffffe9c,
                      in_stack_fffffffffffffe98,0);
      *(float *)&(in_stack_fffffffffffffea0->data).data.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start = in_stack_fffffffffffffe9c;
    }
    std::vector<case_t,_std::allocator<case_t>_>::push_back
              (in_stack_fffffffffffffeb0,
               (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    case_t::~case_t(in_stack_fffffffffffffea0);
  }
  local_9 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0);
  if ((local_9 & 1) == 0) {
    std::vector<case_t,_std::allocator<case_t>_>::~vector(in_stack_fffffffffffffeb0);
  }
  return in_RDI;
}

Assistant:

std::vector<case_t> readTrainingData() {
  std::vector<case_t> cases{};

  auto train_image = readFile("../train-images.idx3-ubyte");
  auto train_labels = readFile("../train-labels.idx1-ubyte");

  // Swap endianness of case count:
  uint32_t case_count = bswap_32(*(uint32_t *) (train_image.data() + sizeof(uint32_t)));

  // Convert each image to a test case
  for (int i = 0; i < case_count; i++) {
    case_t c{tensor_t<float>(img_dim, img_dim, 1), tensor_t<float>(num_digits, 1, 1)};

    // Actual images start at offset 16
    uint8_t *img = train_image.data() + 16 + i * (img_dim * img_dim);

    // Actual labels start at offset 8
    uint8_t *label = train_labels.data() + 8 + i;

    // Normalize the pixel intensity values to a floating point number between 0 and 1.
    for (int x = 0; x < img_dim; x++) {
      for (int y = 0; y < img_dim; y++) {
        c.data(x, y, 0) = img[x + y * img_dim] / 255.f;
      }
    }

    // Convert the labels to a floating point number at the correct digit index
    for (int b = 0; b < num_digits; b++) {
      c.out(b, 0, 0) = *label == b ? 1.0f : 0.0f;
    }

    cases.push_back(c);
  }

  return cases;
}